

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intlog.hpp
# Opt level: O3

uint64_t bitmanip::detail::approximateGuessTable<64ul>(Table<unsigned_char,_64UL> *table)

{
  uint uVar1;
  ulong uVar2;
  uint b;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  _b = 0x21;
  uVar3 = 0;
  do {
    bVar9 = _b == 0;
    _b = _b - 1;
    if (bVar9) {
      return 0xffffffffffffffff;
    }
    uVar2 = uVar3 | 1L << (_b & 0x3f);
    uVar5 = 0;
    lVar7 = 0;
    do {
      uVar6 = (ulong)table->data[lVar7];
      uVar8 = uVar5 >> 0x20;
      if (uVar8 != uVar6) break;
      uVar5 = uVar5 + uVar2;
      bVar9 = lVar7 != 0x3f;
      lVar7 = lVar7 + 1;
    } while (bVar9);
    uVar1 = (uint)(uVar8 < uVar6);
    uVar4 = (uint)(uVar8 >= uVar6 && uVar8 != uVar6);
    if (uVar4 - uVar1 == -1) {
      uVar3 = uVar2;
    }
    if (uVar4 == uVar1) {
      return uVar2;
    }
  } while( true );
}

Assistant:

[[nodiscard]] constexpr std::uint64_t approximateGuessTable(const Table<unsigned char, SIZE> &table) noexcept
{
    std::uint64_t result = 0;
    for (unsigned b = 33; b-- != 0;) {
        std::uint64_t guessedResult = result | (std::uint64_t{1} << b);
        int cmp = compareApproximationToGuessTable(guessedResult, table);
        if (cmp == 0) {
            return guessedResult;
        }
        if (cmp == -1) {
            result = guessedResult;
        }
    }
    return NO_APPROXIMATION;
}